

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall
sqvector<SQClassMember>::resize
          (sqvector<SQClassMember> *this,SQUnsignedInteger newsize,SQClassMember *fill)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQClassMember *pSVar4;
  ulong uVar5;
  long lVar6;
  SQUnsignedInteger SVar7;
  
  if (this->_allocated < newsize) {
    pSVar4 = (SQClassMember *)sq_vm_realloc(this->_vals,this->_allocated << 5,newsize << 5);
    this->_vals = pSVar4;
    this->_allocated = newsize;
  }
  uVar5 = this->_size;
  if (uVar5 < newsize) {
    do {
      pSVar4 = this->_vals;
      SVar2 = (fill->val).super_SQObject._type;
      pSVar4[uVar5].val.super_SQObject._type = SVar2;
      pSVar3 = (fill->val).super_SQObject._unVal.pTable;
      pSVar4[uVar5].val.super_SQObject._unVal.pTable = pSVar3;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      SVar2 = (fill->attrs).super_SQObject._type;
      pSVar4[uVar5].attrs.super_SQObject._type = SVar2;
      pSVar3 = (fill->attrs).super_SQObject._unVal.pTable;
      pSVar4[uVar5].attrs.super_SQObject._unVal.pTable = pSVar3;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      uVar5 = this->_size + 1;
      this->_size = uVar5;
    } while (uVar5 < newsize);
  }
  else {
    if (newsize < uVar5) {
      lVar6 = newsize << 5;
      SVar7 = newsize;
      do {
        pSVar4 = this->_vals;
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(pSVar4->attrs).super_SQObject._type + lVar6));
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(pSVar4->val).super_SQObject._type + lVar6));
        SVar7 = SVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (SVar7 < this->_size);
    }
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }